

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall QtMWidgets::MessageBox::removeButton(MessageBox *this,QAbstractButton *button)

{
  bool bVar1;
  int iVar2;
  MessageBoxPrivate *pMVar3;
  qsizetype qVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  QLayoutItem *l;
  QLayoutItem *b;
  MsgBoxButton *pMStack_18;
  int index;
  QAbstractButton *button_local;
  MessageBox *this_local;
  
  pMStack_18 = (MsgBoxButton *)button;
  button_local = (QAbstractButton *)this;
  pMVar3 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
           ::operator->(&this->d);
  if (pMVar3->okButton != pMStack_18) {
    pMVar3 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
             ::operator->(&this->d);
    bVar1 = QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::contains
                      (&pMVar3->buttonsMap,(QAbstractButton **)&stack0xffffffffffffffe8);
    if (bVar1) {
      pMVar3 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
               ::operator->(&this->d);
      qVar4 = QListSpecialMethodsBase<QAbstractButton*>::indexOf<QAbstractButton*>
                        ((QListSpecialMethodsBase<QAbstractButton*> *)&pMVar3->buttons,
                         (QAbstractButton **)&stack0xffffffffffffffe8,0);
      iVar2 = (int)qVar4;
      if (iVar2 != -1) {
        pMVar3 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
                 ::operator->(&this->d);
        plVar5 = (long *)(**(code **)(*(long *)pMVar3->hbox + 0xb0))(pMVar3->hbox,iVar2 << 1);
        pMVar3 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
                 ::operator->(&this->d);
        plVar6 = (long *)(**(code **)(*(long *)pMVar3->hbox + 0xb0))(pMVar3->hbox,iVar2 * 2 + -1);
        lVar7 = (**(code **)(*plVar6 + 0x68))();
        if (lVar7 != 0) {
          (**(code **)(*plVar6 + 0x68))();
          QObject::deleteLater();
        }
        if (plVar5 != (long *)0x0) {
          (**(code **)(*plVar5 + 8))();
        }
        if (plVar6 != (long *)0x0) {
          (**(code **)(*plVar6 + 8))();
        }
        pMVar3 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
                 ::operator->(&this->d);
        QList<QAbstractButton_*>::removeAt(&pMVar3->buttons,(long)iVar2);
        pMVar3 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
                 ::operator->(&this->d);
        QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::remove
                  (&pMVar3->buttonsMap,(char *)&stack0xffffffffffffffe8);
        pMVar3 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
                 ::operator->(&this->d);
        QList<QFrame_*>::removeAt(&pMVar3->buttonSeparators,(long)(iVar2 + -1));
        QObject::disconnect((QObject *)pMStack_18,(char *)0x0,(QObject *)this,(char *)0x0);
        QObject::deleteLater();
        pMVar3 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
                 ::operator->(&this->d);
        (**(code **)(*(long *)pMVar3->vbox + 0xf0))();
        QWidget::resize((QSize *)this);
        pMVar3 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
                 ::operator->(&this->d);
        MessageBoxPrivate::adjustSize(pMVar3);
      }
    }
  }
  return;
}

Assistant:

void
MessageBox::removeButton( QAbstractButton * button )
{
	if( d->okButton != button && d->buttonsMap.contains( button ) )
	{
		const int index = d->buttons.indexOf( button );

		if( index != -1 )
		{
			QLayoutItem * b = d->hbox->takeAt( index * 2 );
			QLayoutItem * l = d->hbox->takeAt( index * 2 - 1 );

			if( l->widget() )
				l->widget()->deleteLater();

			delete b;
			delete l;

			d->buttons.removeAt( index );
			d->buttonsMap.remove( button );
			d->buttonSeparators.removeAt( index - 1 );

			disconnect( button, 0, this, 0 );

			button->deleteLater();

			resize( d->vbox->sizeHint() );

			d->adjustSize();
		}
	}
}